

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * factor(void)

{
  bool bVar1;
  treeNode *extraout_RAX;
  treeNode *ptVar2;
  double __x;
  allocator local_71;
  string local_70;
  treeNode *local_50;
  treeNode *ret;
  allocator local_31;
  string local_30;
  treeNode *local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"(",&local_31);
  bVar1 = match(&local_30,Empty);
  std::__cxx11::string::~string((string *)&local_30);
  __x = (double)std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (bVar1) {
    exp(__x);
    local_50 = extraout_RAX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,")",&local_71);
    match(&local_70,lackRightBucket);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_10 = local_50;
  }
  else {
    bVar1 = std::operator==(&nextToken.text,"false");
    if ((((!bVar1) && (bVar1 = std::operator==(&nextToken.text,"true"), !bVar1)) &&
        (nextToken.kind != Integer)) &&
       (((nextToken.kind != String && (nextToken.kind != Char)) && (nextToken.kind != Demical)))) {
      ptVar2 = identifiderExp();
      return ptVar2;
    }
    local_10 = constVal();
  }
  return local_10;
}

Assistant:

treeNode* factor()
{
    if(match("("))
    {
        treeNode* ret=exp();
        match(")",Error::lackRightBucket);
        return ret;
    }
    else if(nextToken.text=="false"||nextToken.text=="true"||nextToken.kind==Token::Integer||nextToken.kind==Token::String||nextToken.kind==Token::Char||nextToken.kind==Token::Demical)
    {
        return constVal();
    }
    else
    {
        return identifiderExp();
    }
}